

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<long>::SwapElements
          (RepeatedFieldWrapper<long> *this,Field *data,int index1,int index2)

{
  long lVar1;
  RepeatedField<long> *this_00;
  long *plVar2;
  
  this_00 = (RepeatedField<long> *)(**(code **)(*(long *)this + 0x88))();
  plVar2 = RepeatedField<long>::elements
                     (this_00,(undefined1  [16])
                              ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4
                              ) == (undefined1  [16])0x0);
  lVar1 = plVar2[index1];
  plVar2[index1] = plVar2[index2];
  plVar2[index2] = lVar1;
  return;
}

Assistant:

void SwapElements(Field* data, int index1, int index2) const override {
    MutableRepeatedField(data)->SwapElements(index1, index2);
  }